

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

uint64_t roaring_bitmap_range_cardinality_closed
                   (roaring_bitmap_t *r,uint32_t range_start,uint32_t range_end)

{
  ushort uVar1;
  uint16_t *puVar2;
  bool bVar3;
  uint8_t uVar4;
  ushort uVar5;
  byte bVar6;
  int iVar7;
  ushort uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  run_container_t *prVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint64_t uVar16;
  
  if (range_end < range_start) {
    return 0;
  }
  iVar7 = (r->high_low_container).size;
  if ((long)iVar7 != 0) {
    puVar2 = (r->high_low_container).keys;
    uVar5 = (ushort)(range_start >> 0x10);
    if (puVar2[(long)iVar7 + -1] != uVar5) {
      uVar10 = iVar7 - 1;
      uVar11 = 0;
      uVar13 = uVar10;
      do {
        if ((int)uVar10 < (int)uVar11) {
          uVar14 = ~uVar11;
          break;
        }
        uVar14 = uVar11 + uVar10 >> 1;
        uVar8 = *(ushort *)((long)puVar2 + (ulong)(uVar11 + uVar10 & 0xfffffffe));
        if (uVar8 < uVar5) {
          uVar11 = uVar14 + 1;
          bVar3 = true;
          uVar14 = uVar13;
        }
        else if (uVar5 < uVar8) {
          uVar10 = uVar14 - 1;
          bVar3 = true;
          uVar14 = uVar13;
        }
        else {
          bVar3 = false;
        }
        uVar13 = uVar14;
      } while (bVar3);
      goto LAB_001082d3;
    }
  }
  uVar14 = iVar7 - 1;
LAB_001082d3:
  uVar13 = range_end >> 0x10;
  uVar5 = (ushort)range_end;
  if ((int)uVar14 < 0) {
    uVar14 = ~uVar14;
    uVar16 = 0;
  }
  else {
    prVar12 = (run_container_t *)(r->high_low_container).containers[uVar14];
    bVar6 = (r->high_low_container).typecodes[uVar14];
    if (range_start >> 0x10 == uVar13) {
      if (bVar6 == 4) {
        bVar6 = *(byte *)&prVar12->runs;
        prVar12 = *(run_container_t **)prVar12;
      }
      if (bVar6 == 3) {
        uVar11 = run_container_rank(prVar12,uVar5);
      }
      else if (bVar6 == 2) {
        iVar7 = prVar12->n_runs + -1;
        uVar10 = 0;
        uVar11 = (uint)bVar6;
        do {
          if (iVar7 < (int)uVar10) {
            uVar9 = ~uVar10;
            break;
          }
          uVar9 = uVar10 + iVar7 >> 1;
          uVar8 = *(ushort *)((long)&prVar12->runs->value + (ulong)(uVar10 + iVar7 & 0xfffffffe));
          if (uVar8 < uVar5) {
            uVar10 = uVar9 + 1;
            bVar3 = true;
            uVar9 = uVar11;
          }
          else if (uVar5 < uVar8) {
            iVar7 = uVar9 - 1;
            bVar3 = true;
            uVar9 = uVar11;
          }
          else {
            bVar3 = false;
          }
          uVar11 = uVar9;
        } while (bVar3);
        uVar11 = ~uVar9;
        if (-1 < (int)uVar9) {
          uVar11 = uVar9 + 1;
        }
      }
      else {
        uVar11 = bitset_container_rank((bitset_container_t *)prVar12,uVar5);
      }
    }
    else {
      if (bVar6 == 4) {
        bVar6 = *(byte *)&prVar12->runs;
        prVar12 = *(run_container_t **)prVar12;
      }
      if (bVar6 == 3) {
        uVar11 = run_container_cardinality(prVar12);
      }
      else {
        uVar11 = prVar12->n_runs;
      }
    }
    uVar16 = (uint64_t)(int)uVar11;
    if ((short)range_start != 0) {
      prVar12 = (run_container_t *)(r->high_low_container).containers[uVar14];
      bVar6 = (r->high_low_container).typecodes[uVar14];
      uVar8 = (short)range_start - 1;
      if (bVar6 == 4) {
        bVar6 = *(byte *)&prVar12->runs;
        prVar12 = *(run_container_t **)prVar12;
      }
      if (bVar6 == 3) {
        uVar11 = run_container_rank(prVar12,uVar8);
      }
      else if (bVar6 == 2) {
        iVar7 = prVar12->n_runs + -1;
        uVar10 = 0;
        uVar11 = (uint)bVar6;
        do {
          if (iVar7 < (int)uVar10) {
            uVar9 = ~uVar10;
            break;
          }
          uVar9 = uVar10 + iVar7 >> 1;
          uVar1 = *(ushort *)((long)&prVar12->runs->value + (ulong)(uVar10 + iVar7 & 0xfffffffe));
          if (uVar1 < uVar8) {
            uVar10 = uVar9 + 1;
            bVar3 = true;
            uVar9 = uVar11;
          }
          else if (uVar8 < uVar1) {
            iVar7 = uVar9 - 1;
            bVar3 = true;
            uVar9 = uVar11;
          }
          else {
            bVar3 = false;
          }
          uVar11 = uVar9;
        } while (bVar3);
        uVar11 = ~uVar9;
        if (-1 < (int)uVar9) {
          uVar11 = uVar9 + 1;
        }
      }
      else {
        uVar11 = bitset_container_rank((bitset_container_t *)prVar12,uVar8);
      }
      uVar16 = uVar16 - (long)(int)uVar11;
    }
    uVar14 = uVar14 + 1;
  }
  if ((int)uVar14 < (r->high_low_container).size) {
    uVar15 = (ulong)uVar14;
    do {
      uVar8 = (r->high_low_container).keys[uVar15];
      if (uVar8 < uVar13) {
        prVar12 = (run_container_t *)(r->high_low_container).containers[uVar15];
        uVar4 = (r->high_low_container).typecodes[uVar15];
        if (uVar4 == '\x04') {
          uVar4 = *(uint8_t *)&prVar12->runs;
          prVar12 = *(run_container_t **)prVar12;
        }
        if (uVar4 == '\x03') {
          uVar14 = run_container_cardinality(prVar12);
        }
        else {
          uVar14 = prVar12->n_runs;
        }
LAB_001085a0:
        uVar16 = uVar16 + (long)(int)uVar14;
      }
      else if (uVar13 == uVar8) {
        prVar12 = (run_container_t *)(r->high_low_container).containers[uVar15];
        bVar6 = (r->high_low_container).typecodes[uVar15];
        if (bVar6 == 4) {
          bVar6 = *(byte *)&prVar12->runs;
          prVar12 = *(run_container_t **)prVar12;
        }
        if (bVar6 == 3) {
          uVar14 = run_container_rank(prVar12,uVar5);
        }
        else if (bVar6 == 2) {
          iVar7 = prVar12->n_runs + -1;
          uVar11 = 0;
          uVar14 = (uint)bVar6;
          do {
            if (iVar7 < (int)uVar11) {
              uVar10 = ~uVar11;
              break;
            }
            uVar10 = uVar11 + iVar7 >> 1;
            uVar1 = *(ushort *)((long)&prVar12->runs->value + (ulong)(uVar11 + iVar7 & 0xfffffffe));
            if (uVar1 < uVar5) {
              uVar11 = uVar10 + 1;
              bVar3 = true;
              uVar10 = uVar14;
            }
            else if (uVar5 < uVar1) {
              iVar7 = uVar10 - 1;
              bVar3 = true;
              uVar10 = uVar14;
            }
            else {
              bVar3 = false;
            }
            uVar14 = uVar10;
          } while (bVar3);
          uVar14 = ~uVar10;
          if (-1 < (int)uVar10) {
            uVar14 = uVar10 + 1;
          }
        }
        else {
          uVar14 = bitset_container_rank((bitset_container_t *)prVar12,uVar5);
        }
        goto LAB_001085a0;
      }
    } while ((uVar8 < uVar13) && (uVar15 = uVar15 + 1, (int)uVar15 < (r->high_low_container).size));
  }
  return uVar16;
}

Assistant:

uint64_t roaring_bitmap_range_cardinality_closed(const roaring_bitmap_t *r,
                                                 uint32_t range_start,
                                                 uint32_t range_end) {
    const roaring_array_t *ra = &r->high_low_container;

    if (range_start > range_end) {
        return 0;
    }

    // now we have: 0 <= range_start <= range_end <= UINT32_MAX

    uint16_t minhb = (uint16_t)(range_start >> 16);
    uint16_t maxhb = (uint16_t)(range_end >> 16);

    uint64_t card = 0;

    int i = ra_get_index(ra, minhb);
    if (i >= 0) {
        if (minhb == maxhb) {
            card += container_rank(ra->containers[i], ra->typecodes[i],
                                   range_end & 0xffff);
        } else {
            card +=
                container_get_cardinality(ra->containers[i], ra->typecodes[i]);
        }
        if ((range_start & 0xffff) != 0) {
            card -= container_rank(ra->containers[i], ra->typecodes[i],
                                   (range_start & 0xffff) - 1);
        }
        i++;
    } else {
        i = -i - 1;
    }

    for (; i < ra->size; i++) {
        uint16_t key = ra->keys[i];
        if (key < maxhb) {
            card +=
                container_get_cardinality(ra->containers[i], ra->typecodes[i]);
        } else if (key == maxhb) {
            card += container_rank(ra->containers[i], ra->typecodes[i],
                                   range_end & 0xffff);
            break;
        } else {
            break;
        }
    }

    return card;
}